

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitles.cpp
# Opt level: O0

long __thiscall
text_subtitles::TextToPGSConverter::composeEnd
          (TextToPGSConverter *this,uint8_t *buff,int64_t pts,int64_t dts,bool needPgHeader)

{
  long lVar1;
  uint8_t *startPos;
  uint8_t *curPos;
  bool needPgHeader_local;
  int64_t dts_local;
  int64_t pts_local;
  uint8_t *buff_local;
  TextToPGSConverter *this_local;
  
  startPos = buff;
  if (needPgHeader) {
    lVar1 = writePGHeader(buff,pts,dts);
    startPos = buff + lVar1;
  }
  *startPos = 0x80;
  AV_WB16(startPos + 1,0);
  return (long)(startPos + (3 - (long)buff));
}

Assistant:

long TextToPGSConverter::composeEnd(uint8_t* buff, const int64_t pts, const int64_t dts, const bool needPgHeader)
{
    uint8_t* curPos = buff;
    if (needPgHeader)
        curPos += writePGHeader(curPos, pts, dts);
    *curPos++ = END_DEF_SEGMENT;
    curPos += 2;  // skip length field
    uint8_t* startPos = curPos;
    AV_WB16(startPos - 2, static_cast<uint16_t>(curPos - startPos));
    return static_cast<long>(curPos - buff);
}